

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# npp.cpp
# Opt level: O2

bool __thiscall pg::NPPSolver::atronsubgameup(NPPSolver *this)

{
  ulong *puVar1;
  uint uVar2;
  uint uVar3;
  bitset *pbVar4;
  list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *plVar5;
  _List_node_base *p_Var6;
  Game *pGVar7;
  uint64_t *puVar8;
  uint *puVar9;
  bitset *pbVar10;
  uint64_t *puVar11;
  uint uVar12;
  uint uVar13;
  list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *plVar14;
  long lVar15;
  int *piVar16;
  uint *puVar17;
  long lVar18;
  _List_node_base *p_Var19;
  uint *puVar20;
  int iVar21;
  int iVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  _List_node_base *p_Var27;
  bool bVar28;
  _List_node_base *local_50;
  uint local_34;
  
  pbVar4 = (this->Supgame).super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>._M_impl.
           super__Vector_impl_data._M_start[this->Top];
  plVar5 = (this->Entries).
           super__Vector_base<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*,_std::allocator<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*>_>
           ._M_impl.super__Vector_impl_data._M_start[this->Pivot];
  plVar14 = plVar5;
  do {
    plVar14 = *(list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                **)&(plVar14->
                    super__List_base<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )._M_impl._M_node;
    if (plVar14 == plVar5) {
      iVar21 = (this->T).pointer;
      iVar22 = iVar21;
      do {
        if (iVar22 == 0) {
          return iVar21 != 0;
        }
        (this->T).pointer = iVar22 + -1;
        uVar12 = (this->T).queue[(long)iVar22 + -1];
        pbVar4 = (this->Supgame).super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[this->Top];
        pGVar7 = (this->super_Solver).game;
        lVar15 = *(long *)&((this->Entries).
                            super__Vector_base<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*,_std::allocator<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[this->Pivot]->
                           super__List_base<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           )._M_impl._M_node;
        puVar20 = (uint *)(pGVar7->_inedges + pGVar7->_firstins[(int)uVar12]);
        while( true ) {
          uVar2 = *puVar20;
          uVar25 = (ulong)(int)uVar2;
          if (uVar25 == 0xffffffffffffffff) break;
          uVar26 = uVar25 >> 6;
          if ((((this->outgame)._bits[uVar26] >> (uVar25 & 0x3f) & 1) == 0) &&
             (uVar23 = 1L << (uVar25 & 0x3f), ((this->R)._bits[uVar26] & uVar23) == 0)) {
            if ((pbVar4->_bits[uVar26] & uVar23) == 0) {
              uVar13 = Solver::owner(&this->super_Solver,uVar2);
              if (uVar13 == this->alpha) {
                puVar1 = (this->R)._bits + uVar26;
                *puVar1 = *puVar1 | uVar23;
                this->strategy[uVar25] = uVar12;
              }
              else {
                pGVar7 = (this->super_Solver).game;
                puVar9 = (this->E).queue;
                pbVar10 = (this->Supgame).
                          super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>._M_impl.
                          super__Vector_impl_data._M_start[this->Top];
                puVar8 = (this->outgame)._bits;
                puVar17 = (uint *)(pGVar7->_outedges + pGVar7->_firstouts[uVar25]);
                puVar11 = (this->R)._bits;
                while( true ) {
                  uVar13 = *puVar17;
                  uVar25 = (ulong)(int)uVar13;
                  if (uVar25 == 0xffffffffffffffff) break;
                  uVar24 = uVar25 >> 6;
                  if (((puVar8[uVar24] >> (uVar25 & 0x3f) & 1) == 0) &&
                     (uVar25 = 1L << (uVar25 & 0x3f), (puVar11[uVar24] & uVar25) == 0)) {
                    if ((pbVar10->_bits[uVar24] & uVar25) == 0) {
                      (this->E).pointer = 0;
                      goto LAB_00146542;
                    }
                    iVar22 = (this->E).pointer;
                    (this->E).pointer = iVar22 + 1;
                    puVar9[iVar22] = uVar13;
                  }
                  puVar17 = puVar17 + 1;
                }
                iVar22 = (this->E).pointer;
                lVar18 = (long)iVar22;
                puVar9 = (this->E).queue;
                pbVar10 = (this->Exits).
                          super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>._M_impl.
                          super__Vector_impl_data._M_start[this->Pivot];
                while( true ) {
                  iVar22 = iVar22 + -1;
                  bVar28 = lVar18 == 0;
                  lVar18 = lVar18 + -1;
                  if (bVar28) break;
                  (this->E).pointer = iVar22;
                  uVar3 = puVar9[lVar18];
                  puVar1 = pbVar10->_bits + (uVar3 >> 6);
                  *puVar1 = *puVar1 | 1L << ((ulong)uVar3 & 0x3f);
                }
                this->strategy[uVar2] = -1;
                puVar1 = (this->R)._bits + uVar26;
                *puVar1 = *puVar1 | uVar23;
              }
              iVar22 = (this->T).pointer;
              (this->T).pointer = iVar22 + 1;
              (this->T).queue[iVar22] = uVar2;
            }
            else {
              local_34 = uVar2;
              std::deque<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                        ((deque<unsigned_int,_std::allocator<unsigned_int>_> *)(lVar15 + 0x10),
                         &local_34);
            }
          }
LAB_00146542:
          puVar20 = puVar20 + 1;
        }
        iVar22 = (this->T).pointer;
      } while( true );
    }
    p_Var6 = *(_List_node_base **)
              ((long)&plVar14[2].
                      super__List_base<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ._M_impl._M_node + 0x10);
    p_Var19 = *(_List_node_base **)
               ((long)&plVar14[1].
                       super__List_base<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl._M_node + 8);
    p_Var27 = *(_List_node_base **)
               &plVar14[2].
                super__List_base<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl._M_node;
    local_50 = *(_List_node_base **)
                ((long)&plVar14[2].
                        super__List_base<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        ._M_impl._M_node + 8);
    while (p_Var19 != p_Var6) {
      uVar2 = *(uint *)&p_Var19->_M_next;
      uVar25 = (ulong)(int)uVar2;
      this->pos = uVar2;
      if (((pbVar4->_bits[uVar25 >> 6] >> (uVar25 & 0x3f) & 1) == 0) &&
         (((this->R)._bits[uVar25 >> 6] & 1L << (uVar25 & 0x3f)) == 0)) {
        uVar26 = (ulong)uVar2;
        uVar12 = Solver::owner(&this->super_Solver,uVar2);
        if (uVar12 == this->alpha) {
          pGVar7 = (this->super_Solver).game;
          puVar8 = (this->R)._bits;
          piVar16 = pGVar7->_outedges + pGVar7->_firstouts[uVar25];
          do {
            iVar21 = *piVar16;
            uVar25 = (ulong)iVar21;
            if (uVar25 == 0xffffffffffffffff) goto LAB_001462ee;
            piVar16 = piVar16 + 1;
          } while ((puVar8[uVar25 >> 6] >> (uVar25 & 0x3f) & 1) == 0);
          if (((puVar8[uVar2 >> 6] >> (uVar26 & 0x3f) & 1) != 0) &&
             (iVar22 = this->strategy[uVar26], iVar22 != -1)) {
            iVar21 = iVar22;
          }
          this->strategy[uVar26] = iVar21;
        }
        else {
          pGVar7 = (this->super_Solver).game;
          puVar9 = (this->E).queue;
          pbVar10 = (this->Supgame).super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>.
                    _M_impl.super__Vector_impl_data._M_start[this->Top];
          puVar8 = (this->outgame)._bits;
          puVar17 = (uint *)(pGVar7->_outedges + pGVar7->_firstouts[uVar25]);
          puVar11 = (this->R)._bits;
          while( true ) {
            uVar12 = *puVar17;
            uVar25 = (ulong)(int)uVar12;
            if (uVar25 == 0xffffffffffffffff) break;
            uVar23 = uVar25 >> 6;
            if (((puVar8[uVar23] >> (uVar25 & 0x3f) & 1) == 0) &&
               (uVar25 = 1L << (uVar25 & 0x3f), (puVar11[uVar23] & uVar25) == 0)) {
              if ((pbVar10->_bits[uVar23] & uVar25) == 0) {
                (this->E).pointer = 0;
                goto LAB_001462ee;
              }
              iVar21 = (this->E).pointer;
              (this->E).pointer = iVar21 + 1;
              puVar9[iVar21] = uVar12;
            }
            puVar17 = puVar17 + 1;
          }
          puVar9 = (this->E).queue;
          pbVar10 = (this->Exits).super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>.
                    _M_impl.super__Vector_impl_data._M_start[this->Pivot];
          iVar21 = (this->E).pointer;
          lVar15 = (long)iVar21;
          while( true ) {
            iVar21 = iVar21 + -1;
            bVar28 = lVar15 == 0;
            lVar15 = lVar15 + -1;
            if (bVar28) break;
            (this->E).pointer = iVar21;
            uVar2 = puVar9[lVar15];
            puVar1 = pbVar10->_bits + (uVar2 >> 6);
            *puVar1 = *puVar1 | 1L << ((ulong)uVar2 & 0x3f);
          }
          this->strategy[uVar26] = -1;
        }
        uVar12 = this->pos;
        puVar1 = (this->R)._bits + ((ulong)(long)(int)uVar12 >> 6);
        *puVar1 = *puVar1 | 1L << ((long)(int)uVar12 & 0x3fU);
        iVar21 = (this->T).pointer;
        (this->T).pointer = iVar21 + 1;
        (this->T).queue[iVar21] = uVar12;
      }
LAB_001462ee:
      p_Var19 = (_List_node_base *)((long)&p_Var19->_M_next + 4);
      if (p_Var19 == p_Var27) {
        p_Var19 = local_50->_M_prev;
        local_50 = (_List_node_base *)&local_50->_M_prev;
        p_Var27 = p_Var19 + 0x20;
      }
    }
  } while( true );
}

Assistant:

bool NPPSolver::atronsubgameup()
{
    auto & supgame = *(Supgame[Top]);
    auto & entries = *(Entries[Pivot]);
    auto lend = entries.end();
    for (auto liter = entries.begin(); liter != lend; ++liter)
    {
        auto & rdeque = *liter;
        auto dend = rdeque.end();
        for (auto diter = rdeque.begin(); diter != dend; ++diter)
        {
            pos = *diter;
            if (!supgame[pos] && !R[pos] && isclosedonsubgame(pos))
            {
                R[pos] = true;
                T.push(pos);
            }
        }
    }
    if (T.nonempty())
    {
        do
        {
            pushinqueueonsubgameup(T.pop());
        }
        while (T.nonempty());
        return (true);
    }
    else
    {
        return (false);
    }
}